

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.h
# Opt level: O0

void __thiscall CountDownLatch::countDown(CountDownLatch *this)

{
  MutexLockGuard local_18;
  MutexLockGuard lock;
  CountDownLatch *this_local;
  
  lock.mutex = (MutexLock *)this;
  MutexLockGuard::MutexLockGuard(&local_18,&this->mutex_);
  this->count_ = this->count_ + -1;
  if (this->count_ == 0) {
    Condition::notifyAll(&this->condition_);
  }
  MutexLockGuard::~MutexLockGuard(&local_18);
  return;
}

Assistant:

void countDown() {
        MutexLockGuard lock(mutex_);
        --count_;
        if(count_ == 0) condition_.notifyAll();
    }